

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32.c
# Opt level: O2

uLong adler32_combine(uLong adler1,uLong adler2,long len2)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = len2;
  uVar2 = adler1 & 0xffff;
  uVar5 = uVar2 + (adler2 & 0xffff) + 0xfff0;
  lVar3 = (((adler2 >> 0x10 & 0xffff) + (adler1 >> 0x10 & 0xffff)) -
          SUB168(auVar1 % ZEXT816(0xfff1),0)) +
          (ulong)(uint)((int)uVar2 * SUB164(auVar1 % ZEXT816(0xfff1),0)) % 0xfff1;
  uVar4 = lVar3 + 0xfff1;
  uVar2 = (uVar2 + (adler2 & 0xffff)) - 1;
  if (uVar5 < 0xfff2) {
    uVar2 = uVar5;
  }
  uVar5 = uVar2 - 0xfff1;
  if (uVar2 < 0xfff2) {
    uVar5 = uVar2;
  }
  uVar2 = lVar3 - 0xfff1;
  if (uVar4 < 0x1ffe3) {
    uVar2 = uVar4;
  }
  uVar4 = uVar2 * 0x10000 - 0xfff10000;
  if (uVar2 < 0xfff2) {
    uVar4 = uVar2 * 0x10000;
  }
  return uVar4 | uVar5;
}

Assistant:

uLong ZEXPORT adler32_combine(adler1, adler2, len2)
    uLong adler1;
    uLong adler2;
    z_off_t len2;
{
    unsigned long sum1;
    unsigned long sum2;
    unsigned rem;

    /* the derivation of this formula is left as an exercise for the reader */
    rem = (unsigned)(len2 % BASE);
    sum1 = adler1 & 0xffff;
    sum2 = rem * sum1;
    MOD(sum2);
    sum1 += (adler2 & 0xffff) + BASE - 1;
    sum2 += ((adler1 >> 16) & 0xffff) + ((adler2 >> 16) & 0xffff) + BASE - rem;
    if (sum1 > BASE) sum1 -= BASE;
    if (sum1 > BASE) sum1 -= BASE;
    if (sum2 > (BASE << 1)) sum2 -= (BASE << 1);
    if (sum2 > BASE) sum2 -= BASE;
    return sum1 | (sum2 << 16);
}